

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

collision_configuration_ptr __thiscall
APhyBullet::BulletEngine::createDefaultCollisionConfiguration(BulletEngine *this)

{
  Counter *this_00;
  btDefaultCollisionConstructionInfo *in_stack_00000128;
  btDefaultCollisionConfiguration *in_stack_00000130;
  btDefaultCollisionConfiguration *args;
  btDefaultCollisionConstructionInfo local_30;
  
  ::operator_new(0xb8);
  btDefaultCollisionConstructionInfo::btDefaultCollisionConstructionInfo(&local_30);
  btDefaultCollisionConfiguration::btDefaultCollisionConfiguration
            (in_stack_00000130,in_stack_00000128);
  args = (btDefaultCollisionConfiguration *)&stack0xfffffffffffffff0;
  aphy::makeObject<APhyBullet::BulletCollisionConfiguration,btDefaultCollisionConfiguration*>(args);
  this_00 = aphy::ref<aphy::collision_configuration>::disown
                      ((ref<aphy::collision_configuration> *)args);
  aphy::ref<aphy::collision_configuration>::~ref((ref<aphy::collision_configuration> *)this_00);
  return this_00;
}

Assistant:

collision_configuration_ptr BulletEngine::createDefaultCollisionConfiguration()
{
    return makeObject<BulletCollisionConfiguration> (new btDefaultCollisionConfiguration ()).disown();
}